

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAM.c
# Opt level: O1

void debug_dump_VRAM(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  short sVar16;
  uint16_t uVar17;
  FILE *__stream;
  uint uVar18;
  uint uVar19;
  
  __stream = fopen("VRAM_dump.bin","w");
  if (__stream != (FILE *)0x0) {
    uVar19 = 0xfffffff0;
    do {
      uVar18 = uVar19 + 0x10;
      uVar17 = sanitize_VRAM_address((uint16_t)uVar18);
      bVar1 = VRAM[uVar17];
      sVar16 = (short)uVar19;
      uVar17 = sanitize_VRAM_address(sVar16 + 0x11);
      bVar2 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x12);
      bVar3 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x13);
      bVar4 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x14);
      bVar5 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x15);
      bVar6 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x16);
      bVar7 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x17);
      bVar8 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x18);
      bVar9 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x19);
      bVar10 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x1a);
      bVar11 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x1b);
      bVar12 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x1c);
      bVar13 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x1d);
      bVar14 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x1e);
      bVar15 = VRAM[uVar17];
      uVar17 = sanitize_VRAM_address(sVar16 + 0x1f);
      fprintf(__stream,
              "%04x: %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x\n"
              ,(ulong)uVar18,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,
              (ulong)bVar6,(ulong)bVar7,(ulong)bVar8,(ulong)bVar9,(ulong)bVar10,(ulong)bVar11,
              (ulong)bVar12,(ulong)bVar13,(ulong)bVar14,(ulong)bVar15,(ulong)VRAM[uVar17]);
      uVar19 = uVar18;
    } while (uVar18 < 0x3ff0);
    fclose(__stream);
    return;
  }
  puts("ERROR: Could not open VRAM_dump.bin");
  exit(0);
}

Assistant:

void debug_dump_VRAM() {
    FILE* VRAM_dump = fopen("VRAM_dump.bin", "w");
    if(VRAM_dump == NULL) {
        printf("ERROR: Could not open VRAM_dump.bin\n");
        exit(0);
    }
    for(uint32_t addr = 0; addr < VRAM_SIZE; addr += 0x10) {
        fprintf(VRAM_dump, "%04x: %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x\n",
                addr, read_VRAM(addr), read_VRAM(addr + 0x1), read_VRAM(addr + 0x2), read_VRAM(addr + 0x3), read_VRAM(addr + 0x4),
                read_VRAM(addr + 0x5), read_VRAM(addr + 0x6), read_VRAM(addr + 0x7), read_VRAM(addr + 0x8), read_VRAM(addr + 0x9),
                read_VRAM(addr + 0xA), read_VRAM(addr + 0xB), read_VRAM(addr + 0xC), read_VRAM(addr + 0xD), read_VRAM(addr + 0xE),
                read_VRAM(addr + 0xF));
    }
    fclose(VRAM_dump);
}